

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct_x86_fma::create_pipeline_fp16s(InnerProduct_x86_fma *this,Option *opt)

{
  Mat *this_00;
  void *pvVar1;
  size_t sVar2;
  int *piVar3;
  Allocator *pAVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  void *pvVar8;
  unsigned_short uVar9;
  uint _w;
  uint uVar10;
  Mat *this_01;
  long lVar11;
  long lVar12;
  char cVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  undefined1 (*pauVar24) [16];
  undefined1 (*pauVar25) [16];
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  unsigned_short *puVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  uint local_d8;
  Mat local_c8;
  ulong local_78;
  void *local_70;
  ulong local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  uVar10 = (this->super_InnerProduct).num_output;
  uVar23 = (ulong)uVar10;
  _w = (this->super_InnerProduct).weight_data_size / (int)uVar10;
  cVar13 = '\x01';
  if (opt->use_packing_layout == true) {
    cVar13 = '\b';
    if ((uVar10 & 7) != 0) {
      cVar13 = ((uVar10 & 3) == 0) * '\x03' + '\x01';
    }
  }
  this_00 = &(this->super_InnerProduct).weight_data;
  this_01 = &this->weight_data_tm;
  if (cVar13 == '\x01') {
    Mat::reshape(&local_c8,this_00,_w,uVar10,(Allocator *)0x0);
    cast_float32_to_float16(&local_c8,this_01,opt);
    if (local_c8.refcount != (int *)0x0) {
      LOCK();
      *local_c8.refcount = *local_c8.refcount + -1;
      UNLOCK();
      if (*local_c8.refcount == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          if (local_c8.data != (void *)0x0) {
            free(local_c8.data);
          }
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    local_78 = uVar23;
    if (cVar13 == '\x04') {
      Mat::reshape(&local_c8,this_00,_w,uVar10,(Allocator *)0x0);
      uVar14 = uVar10 + 3;
      if (-1 < (int)uVar10) {
        uVar14 = uVar10;
      }
      Mat::create(this_01,_w,(int)uVar14 >> 2,8,4,(Allocator *)0x0);
      if (3 < (int)uVar10) {
        local_d8 = _w & 0xfffffffc;
        lVar27 = 3;
        lVar28 = 2;
        lVar29 = 1;
        lVar17 = 0;
        uVar23 = 0;
        do {
          pvVar8 = local_c8.data;
          lVar30 = (long)(this->weight_data_tm).w;
          pvVar1 = (this->weight_data_tm).data;
          sVar2 = (this->weight_data_tm).elemsize;
          pauVar24 = (undefined1 (*) [16])((uVar23 >> 2) * lVar30 * sVar2 + (long)pvVar1);
          lVar31 = (long)local_c8.w;
          if ((int)_w < 4) {
            lVar31 = local_c8.elemsize * lVar31;
            lVar15 = lVar31 * uVar23;
            lVar11 = (uVar23 | 1) * lVar31;
            lVar35 = (uVar23 | 2) * lVar31;
            lVar34 = lVar31 * (uVar23 | 3);
            uVar10 = 0;
          }
          else {
            lVar34 = local_c8.elemsize * lVar27 * lVar31;
            lVar35 = local_c8.elemsize * lVar28 * lVar31;
            lVar11 = local_c8.elemsize * lVar29 * lVar31;
            lVar31 = local_c8.elemsize * uVar23 * lVar31;
            iVar22 = 3;
            lVar15 = 0;
            do {
              pauVar25 = pauVar24;
              auVar36 = *(undefined1 (*) [16])((long)local_c8.data + lVar15 + lVar31);
              auVar38 = *(undefined1 (*) [16])((long)local_c8.data + lVar15 + lVar11);
              auVar40 = *(undefined1 (*) [16])((long)local_c8.data + lVar15 + lVar35);
              auVar41 = *(undefined1 (*) [16])((long)local_c8.data + lVar15 + lVar34);
              auVar5 = vpunpckldq_avx(auVar36,auVar38);
              auVar6 = vpunpckldq_avx(auVar40,auVar41);
              auVar36 = vpunpckhdq_avx(auVar36,auVar38);
              auVar38 = vpunpckhdq_avx(auVar40,auVar41);
              auVar41 = vpunpcklqdq_avx(auVar5,auVar6);
              auVar40 = vpunpckhqdq_avx(auVar5,auVar6);
              auVar5 = vpunpcklqdq_avx(auVar36,auVar38);
              auVar36 = vpunpckhqdq_avx(auVar36,auVar38);
              auVar39._16_16_ = auVar40;
              auVar39._0_16_ = auVar41;
              auVar37._16_16_ = auVar36;
              auVar37._0_16_ = auVar5;
              pauVar24 = (undefined1 (*) [16])((long)pvVar1 + lVar15 * 2 + sVar2 * lVar17 * lVar30);
              auVar36 = vcvtps2ph_f16c(auVar39,3);
              *pauVar24 = auVar36;
              auVar36 = vcvtps2ph_f16c(auVar37,3);
              pauVar24[1] = auVar36;
              iVar22 = iVar22 + 4;
              lVar15 = lVar15 + 0x10;
              pauVar24 = pauVar24 + 2;
            } while (iVar22 < (int)_w);
            pauVar24 = pauVar25 + 2;
            lVar34 = lVar34 + lVar15;
            lVar35 = lVar35 + lVar15;
            lVar11 = lVar11 + lVar15;
            lVar15 = lVar31 + lVar15;
            uVar10 = local_d8;
          }
          if ((int)uVar10 < (int)_w) {
            lVar30 = 0;
            do {
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar30 * 4 + lVar15));
              *(unsigned_short *)(*pauVar24 + lVar30 * 8) = uVar9;
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar30 * 4 + lVar11));
              *(unsigned_short *)(*pauVar24 + lVar30 * 8 + 2) = uVar9;
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar30 * 4 + lVar35));
              *(unsigned_short *)(*pauVar24 + lVar30 * 8 + 4) = uVar9;
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar30 * 4 + lVar34));
              *(unsigned_short *)(*pauVar24 + lVar30 * 8 + 6) = uVar9;
              lVar30 = lVar30 + 1;
            } while (_w - uVar10 != (int)lVar30);
          }
          uVar23 = uVar23 + 4;
          lVar27 = lVar27 + 4;
          lVar28 = lVar28 + 4;
          lVar29 = lVar29 + 4;
          lVar17 = lVar17 + 1;
        } while ((int)((uint)uVar23 | 3) < (int)local_78);
      }
      if (local_c8.refcount != (int *)0x0) {
        LOCK();
        *local_c8.refcount = *local_c8.refcount + -1;
        UNLOCK();
        if (*local_c8.refcount == 0) {
          if (local_c8.allocator == (Allocator *)0x0) {
            if (local_c8.data != (void *)0x0) {
              free(local_c8.data);
            }
          }
          else {
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else if (cVar13 == '\b') {
      Mat::reshape(&local_c8,this_00,_w,uVar10,(Allocator *)0x0);
      uVar14 = uVar10 + 7;
      if (-1 < (int)uVar10) {
        uVar14 = uVar10;
      }
      Mat::create(this_01,_w,(int)uVar14 >> 3,0x10,8,(Allocator *)0x0);
      if (7 < (int)uVar10) {
        lVar17 = 1;
        lVar27 = 2;
        lVar28 = 3;
        lVar29 = 4;
        lVar30 = 5;
        lVar31 = 6;
        lVar35 = 7;
        lVar34 = 0;
        uVar23 = 0;
        do {
          pvVar8 = local_c8.data;
          lVar15 = (long)(this->weight_data_tm).w;
          pvVar1 = (this->weight_data_tm).data;
          sVar2 = (this->weight_data_tm).elemsize;
          puVar32 = (unsigned_short *)((uVar23 >> 3) * lVar15 * sVar2 + (long)pvVar1);
          lVar11 = (long)local_c8.w;
          if ((int)_w < 8) {
            lVar11 = local_c8.elemsize * lVar11;
            lVar16 = lVar11 * uVar23;
            lVar26 = (uVar23 | 1) * lVar11;
            lVar18 = (uVar23 | 2) * lVar11;
            lVar19 = (uVar23 | 3) * lVar11;
            lVar20 = (uVar23 | 4) * lVar11;
            lVar21 = (uVar23 | 5) * lVar11;
            lVar33 = (uVar23 | 6) * lVar11;
            lVar11 = lVar11 * (uVar23 | 7);
            uVar10 = 0;
          }
          else {
            lVar15 = sVar2 * lVar34 * lVar15;
            lVar16 = local_c8.elemsize * uVar23 * lVar11;
            lVar26 = local_c8.elemsize * lVar17 * lVar11;
            lVar18 = local_c8.elemsize * lVar27 * lVar11;
            lVar19 = local_c8.elemsize * lVar28 * lVar11;
            lVar20 = local_c8.elemsize * lVar29 * lVar11;
            lVar21 = local_c8.elemsize * lVar30 * lVar11;
            lVar33 = local_c8.elemsize * lVar31 * lVar11;
            lVar11 = local_c8.elemsize * lVar35 * lVar11;
            local_70 = local_c8.data;
            iVar22 = 7;
            lVar12 = 0;
            do {
              auVar36 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_c8.data + lVar12 + lVar16)
                                       ,3);
              auVar38 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_c8.data + lVar12 + lVar26)
                                       ,3);
              auVar40 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_c8.data + lVar12 + lVar18)
                                       ,3);
              auVar41 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_c8.data + lVar12 + lVar19)
                                       ,3);
              auVar42 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_c8.data + lVar12 + lVar20)
                                       ,3);
              auVar43 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_c8.data + lVar12 + lVar21)
                                       ,3);
              auVar44 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_c8.data + lVar12 + lVar33)
                                       ,3);
              auVar45 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_c8.data + lVar12 + lVar11)
                                       ,3);
              auVar5 = vpunpcklwd_avx(auVar36,auVar38);
              auVar36 = vpunpckhwd_avx(auVar36,auVar38);
              auVar6 = vpunpcklwd_avx(auVar40,auVar41);
              auVar38 = vpunpckhwd_avx(auVar40,auVar41);
              auVar7 = vpunpcklwd_avx(auVar42,auVar43);
              auVar40 = vpunpckhwd_avx(auVar42,auVar43);
              auVar42 = vpunpcklwd_avx(auVar44,auVar45);
              auVar41 = vpunpckhwd_avx(auVar44,auVar45);
              auVar43 = vpunpckldq_avx(auVar5,auVar6);
              auVar5 = vpunpckhdq_avx(auVar5,auVar6);
              auVar6 = vpunpckldq_avx(auVar36,auVar38);
              auVar36 = vpunpckhdq_avx(auVar36,auVar38);
              auVar44 = vpunpckldq_avx(auVar7,auVar42);
              auVar38 = vpunpckhdq_avx(auVar7,auVar42);
              auVar7 = vpunpckldq_avx(auVar40,auVar41);
              auVar40 = vpunpckhdq_avx(auVar40,auVar41);
              auVar42 = vpunpcklqdq_avx(auVar43,auVar44);
              auVar41 = vpunpckhqdq_avx(auVar43,auVar44);
              auVar43 = vpunpcklqdq_avx(auVar5,auVar38);
              auVar38 = vpunpckhqdq_avx(auVar5,auVar38);
              auVar44 = vpunpcklqdq_avx(auVar6,auVar7);
              auVar5 = vpunpckhqdq_avx(auVar6,auVar7);
              auVar6 = vpunpcklqdq_avx(auVar36,auVar40);
              auVar36 = vpunpckhqdq_avx(auVar36,auVar40);
              *(undefined1 (*) [16])((long)pvVar1 + lVar12 * 4 + lVar15) = auVar42;
              *(undefined1 (*) [16])((long)pvVar1 + lVar12 * 4 + lVar15 + 0x10) = auVar41;
              *(undefined1 (*) [16])((long)pvVar1 + lVar12 * 4 + lVar15 + 0x20) = auVar43;
              *(undefined1 (*) [16])((long)pvVar1 + lVar12 * 4 + lVar15 + 0x30) = auVar38;
              *(undefined1 (*) [16])((long)pvVar1 + lVar12 * 4 + lVar15 + 0x40) = auVar44;
              *(undefined1 (*) [16])((long)pvVar1 + lVar12 * 4 + lVar15 + 0x50) = auVar5;
              *(undefined1 (*) [16])((long)pvVar1 + lVar12 * 4 + lVar15 + 0x60) = auVar6;
              *(undefined1 (*) [16])((long)pvVar1 + lVar12 * 4 + lVar15 + 0x70) = auVar36;
              puVar32 = puVar32 + 0x40;
              lVar12 = lVar12 + 0x20;
              iVar22 = iVar22 + 8;
            } while (iVar22 < (int)_w);
            lVar16 = lVar16 + lVar12;
            lVar26 = lVar26 + lVar12;
            lVar18 = lVar18 + lVar12;
            lVar19 = lVar19 + lVar12;
            lVar20 = lVar20 + lVar12;
            lVar21 = lVar21 + lVar12;
            lVar33 = lVar33 + lVar12;
            lVar11 = lVar11 + lVar12;
            uVar10 = _w & 0xfffffff8;
          }
          local_68 = uVar23;
          local_60 = lVar34;
          local_58 = lVar35;
          local_50 = lVar31;
          local_48 = lVar30;
          local_40 = lVar29;
          local_38 = lVar28;
          if ((int)uVar10 < (int)_w) {
            lVar28 = 0;
            do {
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar28 * 4 + lVar16));
              *puVar32 = uVar9;
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar28 * 4 + lVar26));
              puVar32[1] = uVar9;
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar28 * 4 + lVar18));
              puVar32[2] = uVar9;
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar28 * 4 + lVar19));
              puVar32[3] = uVar9;
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar28 * 4 + lVar20));
              puVar32[4] = uVar9;
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar28 * 4 + lVar21));
              puVar32[5] = uVar9;
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar28 * 4 + lVar33));
              puVar32[6] = uVar9;
              uVar9 = float32_to_float16(*(float *)((long)pvVar8 + lVar28 * 4 + lVar11));
              puVar32[7] = uVar9;
              puVar32 = puVar32 + 8;
              lVar28 = lVar28 + 1;
            } while (_w - uVar10 != (int)lVar28);
          }
          uVar23 = local_68 + 8;
          lVar34 = local_60 + 1;
          lVar17 = lVar17 + 8;
          lVar27 = lVar27 + 8;
          lVar28 = local_38 + 8;
          lVar29 = local_40 + 8;
          lVar30 = local_48 + 8;
          lVar31 = local_50 + 8;
          lVar35 = local_58 + 8;
        } while ((int)((uint)uVar23 | 7) < (int)local_78);
      }
      if (local_c8.refcount != (int *)0x0) {
        LOCK();
        *local_c8.refcount = *local_c8.refcount + -1;
        UNLOCK();
        if (*local_c8.refcount == 0) {
          if (local_c8.allocator == (Allocator *)0x0) {
            if (local_c8.data != (void *)0x0) {
              free(local_c8.data);
            }
          }
          else {
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
  }
  if (opt->lightmode == true) {
    piVar3 = (this->super_InnerProduct).weight_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar1 = (this->super_InnerProduct).weight_data.data;
        pAVar4 = (this->super_InnerProduct).weight_data.allocator;
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar1 != (void *)0x0) {
            free(pvVar1);
          }
        }
        else {
          (*pAVar4->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_InnerProduct).weight_data.cstep = 0;
    *(undefined1 (*) [16])((long)&(this->super_InnerProduct).weight_data.refcount + 4) =
         (undefined1  [16])0x0;
    this_00->data = (void *)0x0;
    this_00->refcount = (int *)0x0;
    (this->super_InnerProduct).weight_data.dims = 0;
    (this->super_InnerProduct).weight_data.w = 0;
    (this->super_InnerProduct).weight_data.h = 0;
    (this->super_InnerProduct).weight_data.d = 0;
    (this->super_InnerProduct).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86_fma::create_pipeline_fp16s(const Option& opt)
{
    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_fp16s_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}